

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>
* __thiscall
phmap::priv::
btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>
::child(btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>
        *this,size_type i)

{
  template_ElementType<3UL> *ppbVar1;
  size_type i_local;
  btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>
  *this_local;
  
  ppbVar1 = btree_node<phmap::priv::set_params<std::__cxx11::string,phmap::priv::(anonymous_namespace)::NonTransparentCompare,std::allocator<std::__cxx11::string>,256,false>>
            ::GetField<3ul>((btree_node<phmap::priv::set_params<std::__cxx11::string,phmap::priv::(anonymous_namespace)::NonTransparentCompare,std::allocator<std::__cxx11::string>,256,false>>
                             *)this);
  return ppbVar1[i];
}

Assistant:

btree_node *child(size_type i) const { return GetField<3>()[i]; }